

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF.cc
# Opt level: O0

QPDFObjectHandle __thiscall QPDF::getTrailer(QPDF *this)

{
  pointer pMVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_> *in_RSI;
  QPDFObjectHandle QVar2;
  QPDF *this_local;
  
  pMVar1 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(in_RSI);
  QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)this,&pMVar1->trailer);
  QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDF::getTrailer()
{
    return m->trailer;
}